

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.h
# Opt level: O1

tensor * __thiscall
dlib::tensor::operator=
          (tensor *this,
          matrix_exp<dlib::matrix_op<dlib::op_scale_rows<dlib::matrix_subtract_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_scale_rows<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>
          *item)

{
  int iVar1;
  undefined4 extraout_var;
  ostream *poVar2;
  fatal_error *this_00;
  ostringstream dlib_o_out;
  string local_1b0;
  assignable_ptr_matrix<float> local_190;
  uint auStack_178 [88];
  
  if ((this->m_n == *(long *)(**(long **)item + 8)) &&
     (this->m_nc * this->m_nr * this->m_k - *(long *)(**(long **)item + 0x10) == 0)) {
    iVar1 = (*this->_vptr_tensor[4])(this);
    local_190.ptr = (float *)CONCAT44(extraout_var,iVar1);
    local_190.height = this->m_n;
    local_190.width = this->m_nc * this->m_nr * this->m_k;
    assignable_ptr_matrix<float>::operator=(&local_190,item);
    return this;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_190);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_190,"\n\nError detected at line ",0x19);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&local_190,0x79);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,".\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_190,"Error detected in file ",0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_190,
             "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/tensor.h"
             ,0x73);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_190,".\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_190,"Error detected in function ",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_190,
             "tensor &dlib::tensor::operator=(const matrix_exp<EXP> &) [EXP = dlib::matrix_op<dlib::op_scale_rows<dlib::matrix_subtract_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>>, dlib::matrix_op<dlib::op_scale_rows<dlib::matrix_op<dlib::op_pointer_to_mat<float>>, dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>>, dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>]"
             ,0x16a);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_190,".\n\n",3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_190,"Failing expression was ",0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_190,"num_samples() == item.nr() && nr()*nc()*k() == item.nc()",0x38);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_190,".\n",2);
  *(uint *)((long)auStack_178 + *(long *)(local_190.ptr + -6)) =
       *(uint *)((long)auStack_178 + *(long *)(local_190.ptr + -6)) | 1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_190,"",0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_190,"\n",1);
  this_00 = (fatal_error *)__cxa_allocate_exception(0x30);
  std::__cxx11::stringbuf::str();
  fatal_error::fatal_error(this_00,EBROKEN_ASSERT,&local_1b0);
  __cxa_throw(this_00,&fatal_error::typeinfo,error::~error);
}

Assistant:

long long nc() const { return m_nc; }